

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inversion.hpp
# Opt level: O1

void __thiscall OpenMD::Inversion::~Inversion(Inversion *this)

{
  ~Inversion(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

virtual ~Inversion() {}